

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O1

DdNode * zdd_subset1_aux(DdManager *zdd,DdNode *P,DdNode *zvar)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *E;
  DdNode *P_00;
  
  P_00 = zdd->zero;
  pDVar4 = cuddCacheLookup2Zdd(zdd,zdd_subset1_aux,P,zvar);
  if (pDVar4 != (DdNode *)0x0) {
    return pDVar4;
  }
  if ((((ulong)P->index == 0x7fffffff) ||
      (iVar2 = zdd->permZ[zvar->index], iVar3 = zdd->permZ[P->index], iVar2 < iVar3)) ||
     (P_00 = (P->type).kids.T, iVar3 == iVar2)) {
LAB_008001fd:
    cuddCacheInsert2(zdd,zdd_subset1_aux,P,zvar,P_00);
  }
  else {
    pDVar4 = zdd_subset1_aux(zdd,P_00,zvar);
    if (pDVar4 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      E = zdd_subset1_aux(zdd,(P->type).kids.E,zvar);
      if (E != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        P_00 = cuddZddGetNode(zdd,P->index,pDVar4,E);
        if (P_00 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          goto LAB_008001fd;
        }
        Cudd_RecursiveDerefZdd(zdd,pDVar4);
        pDVar4 = E;
      }
      Cudd_RecursiveDerefZdd(zdd,pDVar4);
    }
    P_00 = (DdNode *)0x0;
  }
  return P_00;
}

Assistant:

static DdNode *
zdd_subset1_aux(
  DdManager * zdd,
  DdNode * P,
  DdNode * zvar)
{
    int         top_var, level;
    DdNode      *res, *t, *e;
    DdNode      *empty;

    statLine(zdd);
    empty = DD_ZERO(zdd);

    /* Check cache. */
    res = cuddCacheLookup2Zdd(zdd, zdd_subset1_aux, P, zvar);
    if (res != NULL)
        return(res);

    if (cuddIsConstant(P)) {
        res = empty;
        cuddCacheInsert2(zdd, zdd_subset1_aux, P, zvar, res);
        return(res);
    }

    top_var = zdd->permZ[P->index];
    level = zdd->permZ[zvar->index];

    if (top_var > level) {
        res = empty;
    } else if (top_var == level) {
        res = cuddT(P);
    } else {
        t = zdd_subset1_aux(zdd, cuddT(P), zvar);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = zdd_subset1_aux(zdd, cuddE(P), zvar);
        if (e == NULL) {
            Cudd_RecursiveDerefZdd(zdd, t);
            return(NULL);
        }
        cuddRef(e);
        res = cuddZddGetNode(zdd, P->index, t, e);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(zdd, t);
            Cudd_RecursiveDerefZdd(zdd, e);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert2(zdd, zdd_subset1_aux, P, zvar, res);

    return(res);

}